

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::SetEnumValue
          (Reflection *this,Message *message,FieldDescriptor *field,int value)

{
  bool bVar1;
  CppType CVar2;
  int number;
  Reflection *pRVar3;
  Descriptor *actual;
  Descriptor *pDVar4;
  EnumDescriptor *this_00;
  EnumValueDescriptor *pEVar5;
  UnknownFieldSet *this_01;
  EnumValueDescriptor *value_desc;
  int value_local;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  pRVar3 = Message::GetReflection(message);
  if (this != pRVar3) {
    pDVar4 = this->descriptor_;
    actual = Message::GetDescriptor(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar4,actual,field,"SetEnumValue");
  }
  pDVar4 = FieldDescriptor::containing_type(field);
  if (pDVar4 != this->descriptor_) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,field,"SetEnumValue","Field does not match message type.");
  }
  bVar1 = FieldDescriptor::is_repeated(field);
  if (bVar1) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,field,"SetEnumValue",
               "Field is repeated; the method requires a singular field.");
  }
  CVar2 = FieldDescriptor::cpp_type(field);
  if (CVar2 != CPPTYPE_ENUM) {
    anon_unknown_6::ReportReflectionUsageTypeError
              (this->descriptor_,field,"SetEnumValue",CPPTYPE_ENUM);
  }
  bVar1 = internal::CreateUnknownEnumValues(field);
  if (!bVar1) {
    this_00 = FieldDescriptor::enum_type(field);
    pEVar5 = EnumDescriptor::FindValueByNumber(this_00,value);
    if (pEVar5 == (EnumValueDescriptor *)0x0) {
      this_01 = MutableUnknownFields(this,message);
      number = FieldDescriptor::number(field);
      UnknownFieldSet::AddVarint(this_01,number,(long)value);
      return;
    }
  }
  SetEnumValueInternal(this,message,field,value);
  return;
}

Assistant:

void Reflection::SetEnumValue(Message* message, const FieldDescriptor* field,
                              int value) const {
  USAGE_MUTABLE_CHECK_ALL(SetEnumValue, SINGULAR, ENUM);
  if (!CreateUnknownEnumValues(field)) {
    // Check that the value is valid if we don't support direct storage of
    // unknown enum values.
    const EnumValueDescriptor* value_desc =
        field->enum_type()->FindValueByNumber(value);
    if (value_desc == nullptr) {
      MutableUnknownFields(message)->AddVarint(field->number(), value);
      return;
    }
  }
  SetEnumValueInternal(message, field, value);
}